

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComparatorFactory.cpp
# Opt level: O3

shared_ptr<ApprovalTests::ApprovalComparator> __thiscall
ApprovalTests::ComparatorFactory::getComparatorForFile(ComparatorFactory *this,string *receivedPath)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<ApprovalTests::ApprovalComparator> sVar2;
  string fileExtension;
  string local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  FileUtils::getExtensionWithDot(&local_30,receivedPath);
  sVar2 = getComparatorForFileExtensionWithDot(this,&local_30);
  _Var1 = sVar2.super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
    _Var1._M_pi = extraout_RDX;
  }
  sVar2.super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<ApprovalTests::ApprovalComparator>)
         sVar2.super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ApprovalComparator>
    ComparatorFactory::getComparatorForFile(const std::string& receivedPath)
    {
        const std::string fileExtension = FileUtils::getExtensionWithDot(receivedPath);
        return getComparatorForFileExtensionWithDot(fileExtension);
    }